

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureSocket.cpp
# Opt level: O0

void __thiscall Jupiter::SecureSocket::SecureSocket(SecureSocket *this)

{
  SSLData *this_00;
  SecureSocket *this_local;
  
  Socket::Socket(&this->super_Socket);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR_connect_001ea840;
  this_00 = (SSLData *)operator_new(0x58);
  memset(this_00,0,0x58);
  SSLData::SSLData(this_00);
  this->m_ssl_data = this_00;
  return;
}

Assistant:

Jupiter::SecureSocket::SecureSocket() : Jupiter::Socket() {
	m_ssl_data = new Jupiter::SecureSocket::SSLData();
}